

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O1

int sptk::snack::dp_f0(float *fdata,int buff_size,int sdstep,double freq,F0_params *par,
                      float **f0p_pt,float **vuvp_pt,float **rms_speech_pt,float **acpkp_pt,
                      int *vecsize,int last_time,Buffer *buffer)

{
  ushort uVar1;
  int *piVar2;
  Dprec *pDVar3;
  float *pfVar4;
  F0_params *pFVar5;
  uint uVar6;
  ulong uVar7;
  Stat *pSVar8;
  Buffer *pBVar9;
  Frame *pFVar10;
  int size;
  int iVar11;
  long lVar12;
  Buffer *pdata;
  size_t size_00;
  ulong uVar13;
  frame_rec *pfVar14;
  uint uVar15;
  Buffer *pBVar16;
  Frame *pFVar17;
  ulong uVar18;
  float *pfVar19;
  float *rmsa;
  short *psVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  short sVar24;
  int iVar25;
  undefined1 *puVar26;
  int iVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  double dVar31;
  double dVar32;
  double extraout_XMM0_Qa;
  float fVar33;
  Stat *local_f8;
  int local_e8;
  float maxval;
  int *local_c8;
  int *local_c0;
  float *local_b8;
  int ncand;
  float *local_a8;
  Stat *local_a0;
  double local_98;
  float *local_90;
  ulong local_88;
  F0_params *local_80;
  ulong local_78;
  int local_70;
  int samsds;
  int maxloc;
  float engref;
  ulong local_60;
  Buffer *local_58;
  ulong local_50;
  float *local_48;
  float **local_40;
  float **local_38;
  
  uVar7 = 0;
  if (buffer->pad <= buff_size) {
    uVar7 = ((long)buff_size - (long)buffer->pad) / (long)buffer->step;
  }
  local_98 = freq;
  local_80 = par;
  local_40 = f0p_pt;
  local_38 = vuvp_pt;
  if (debug_level != 0) {
    fprintf(_stderr,"******* Computing %d dp frames ******** from %d points\n",uVar7 & 0xffffffff,
            buff_size);
  }
  iVar25 = (int)(local_98 / 2000.0);
  iVar11 = (int)uVar7;
  local_58 = (Buffer *)fdata;
  if (1 < iVar25) {
    samsds = ((iVar11 + -1) * buffer->step + buffer->ncomp) / iVar25;
    if (samsds < 1) {
      return 1;
    }
    local_c0 = &buffer->ncoeff;
    local_c8 = &buffer->ncoefft;
    local_b8 = buffer->b;
    local_58 = (Buffer *)
               downsample(fdata,buff_size,sdstep,local_98,&samsds,iVar25,buffer->first_time,
                          last_time,local_c0,local_c8,local_b8,&buffer->foutput,&buffer->co,
                          &buffer->mem,buffer->state,&buffer->fsize);
    if (local_58 == (Buffer *)0x0) {
      dp_f0();
      return 1;
    }
  }
  uVar6 = buffer->step;
  lVar21 = (long)(int)uVar6;
  local_f8 = buffer->stat;
  pfVar19 = buffer->mem;
  iVar27 = (int)(local_98 * 0.02);
  size = (int)(local_98 * 0.03);
  local_88 = CONCAT44(local_88._4_4_,buffer->first_time);
  dVar32 = local_98;
  local_70 = iVar25;
  if (((buffer->first_time == 0) && (iVar11 <= buffer->nframes_old)) && (local_f8 != (Stat *)0x0)) {
    uVar15 = buffer->memsize;
  }
  else {
    if (local_f8 != (Stat *)0x0) {
      ckfree(local_f8->stat);
      ckfree(local_f8->rms);
      ckfree(local_f8->rms_ratio);
      ckfree(local_f8);
    }
    if (pfVar19 != (float *)0x0) {
      ckfree(pfVar19);
    }
    local_f8 = (Stat *)ckalloc(0x18);
    size_00 = (long)iVar11 << 2;
    pfVar19 = (float *)ckalloc(size_00);
    local_f8->stat = pfVar19;
    pfVar19 = (float *)ckalloc(size_00);
    local_f8->rms = pfVar19;
    pfVar19 = (float *)ckalloc(size_00);
    local_f8->rms_ratio = pfVar19;
    uVar15 = size + iVar27;
    pfVar19 = (float *)ckalloc((long)(int)uVar15 * 4);
    if (0 < (int)uVar15) {
      memset(pfVar19,0,(ulong)(uVar15 - 1) * 4 + 4);
    }
    buffer->nframes_old = iVar11;
    buffer->memsize = uVar15;
    buffer->stat = local_f8;
    buffer->mem = pfVar19;
  }
  uVar13 = (ulong)uVar15;
  if (iVar11 != 0) {
    dVar31 = local_98 / 1000.0 + 2.0;
    local_e8 = (int)dVar31;
    if (100 < local_e8) {
      fprintf(_stderr,"Optimim order (%d) exceeds that allowable (%d); reduce Fs\n",local_e8,100);
      local_e8 = 100;
      dVar31 = extraout_XMM0_Qa;
    }
    uVar23 = (ulong)(uint)((int)uVar15 / 2);
    pBVar9 = (Buffer *)fdata;
    uVar18 = uVar23;
    if (0 < (int)uVar15) {
      do {
        dVar31 = (double)(ulong)(uint)*(float *)&pBVar9->headF;
        pfVar19[uVar18] = *(float *)&pBVar9->headF;
        uVar18 = uVar18 + 1;
        pBVar9 = (Buffer *)((long)&pBVar9->headF + 4);
      } while (uVar18 < uVar13);
    }
    local_a8 = pfVar19;
    local_60 = uVar13;
    if (0 < iVar11) {
      lVar12 = (long)((iVar27 - size) / 2);
      pBVar9 = (Buffer *)((long)&((Buffer *)fdata)->headF + lVar12 * 4);
      pfVar4 = (float *)((long)&((Buffer *)fdata)->headF + (long)buff_size * 4);
      pBVar16 = (Buffer *)((long)pBVar9 + (long)iVar27 * -4);
      local_c0 = (int *)(long)size;
      local_a0 = (Stat *)&local_f8->rms_ratio;
      local_48 = pfVar19 + lVar12 + (int)uVar15 / 2;
      local_50 = (ulong)(uVar15 - uVar6);
      local_c8 = (int *)(uVar7 & 0xffffffff);
      local_78 = (ulong)uVar6;
      local_90 = pfVar19 + (int)(uVar15 - uVar6);
      lVar12 = (long)&((Buffer *)fdata)->headF + (long)local_c0 * 4 + lVar12 * 4;
      local_b8 = (float *)(lVar21 * 4);
      puVar26 = (undefined1 *)0x0;
      do {
        pfVar19 = (float *)((long)&pBVar9->headF + (long)local_c0 * 4);
        if (((pBVar16 < fdata) || (pBVar9 < fdata)) || (pfVar4 < pfVar19)) {
          if ((int)local_88 != 0) {
            rmsa = local_f8->rms + (long)puVar26;
            if (((pBVar16 < fdata) && (fdata <= pBVar9)) && (pfVar19 <= pfVar4)) {
              pfVar19 = local_a0->stat;
              pdata = (Buffer *)0x0;
              iVar25 = 1;
              goto LAB_00118e21;
            }
            *rmsa = 0.0;
            local_f8->stat[(long)puVar26] = 0.002;
            dVar31 = 5.26354424712089e-315;
            pSVar8 = local_a0;
            goto LAB_00118e37;
          }
          if ((pBVar16 < fdata) && (pfVar19 <= pfVar4)) {
            fVar29 = get_similarity(local_e8,size,local_a8,local_48,local_f8->rms + (long)puVar26,
                                    local_f8->rms_ratio + (long)puVar26,SUB84(dVar31,0),
                                    SUB84(dVar32,0),0,(int)buffer,(Buffer *)fdata);
            dVar31 = (double)(ulong)(uint)fVar29;
            local_f8->stat[(long)puVar26] = fVar29;
            if ((Buffer *)((long)&pBVar16->headF + lVar21 * 4) < fdata) {
              pfVar19 = local_a8;
              uVar13 = local_50;
              if (0 < (int)local_50) {
                do {
                  dVar31 = (double)(ulong)(uint)pfVar19[lVar21];
                  *pfVar19 = pfVar19[lVar21];
                  pfVar19 = pfVar19 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              if (0 < (int)uVar6) {
                uVar13 = 0;
                do {
                  fVar29 = *(float *)(lVar12 + uVar13 * 4);
                  dVar31 = (double)(ulong)(uint)fVar29;
                  local_90[uVar13] = fVar29;
                  uVar13 = uVar13 + 1;
                } while (local_78 != uVar13);
              }
            }
          }
        }
        else {
          rmsa = local_f8->rms + (long)puVar26;
          pfVar19 = local_f8->rms_ratio;
          iVar25 = 0;
          pdata = pBVar16;
LAB_00118e21:
          fVar29 = get_similarity(local_e8,size,(float *)pdata,(float *)pBVar9,rmsa,
                                  pfVar19 + (long)puVar26,SUB84(dVar31,0),SUB84(dVar32,0),iVar25,
                                  (int)buffer,(Buffer *)fdata);
          dVar31 = (double)(ulong)(uint)fVar29;
          pSVar8 = local_f8;
LAB_00118e37:
          pSVar8->stat[(long)puVar26] = SUB84(dVar31,0);
        }
        puVar26 = puVar26 + 1;
        pBVar16 = (Buffer *)((long)&pBVar16->headF + lVar21 * 4);
        pBVar9 = (Buffer *)((long)&pBVar9->headF + lVar21 * 4);
        lVar12 = lVar12 + (long)local_b8;
      } while ((int *)puVar26 != local_c8);
    }
    if ((1 < (int)local_60) &&
       (fdata <= (Buffer *)((long)fdata + (long)(int)(uVar6 * iVar11) * 4 + -4))) {
      pBVar9 = (Buffer *)((long)fdata + (long)(int)(uVar6 * iVar11) * 4 + -8);
      do {
        local_a8[uVar23 - 1] = *(float *)((long)&pBVar9->headF + 4);
        if ((long)uVar23 < 2) break;
        uVar23 = uVar23 - 1;
        bVar28 = fdata <= pBVar9;
        pBVar9 = (Buffer *)&pBVar9[-1].dbsize;
      } while (bVar28);
    }
  }
  if (local_f8 == (Stat *)0x0) {
    dp_f0();
    return 1;
  }
  local_c0 = (int *)local_f8->stat;
  local_c8 = (int *)local_f8->rms_ratio;
  if ((0 < iVar11) && (buffer->first_time == 0)) {
    buffer->headF = buffer->headF->next;
  }
  if (0 < iVar11) {
    local_a0 = (Stat *)&buffer->size_cir_buffer;
    local_88 = uVar7 & 0xffffffff;
    uVar7 = 0;
    do {
      if (buffer->headF == buffer->tailF->prev) {
        uVar6 = buffer->cir_buff_growth_count;
        if ((int)uVar6 < 6) {
          if (debug_level != 0) {
            dp_f0((snack *)local_a0);
          }
          pFVar10 = alloc_frame(buffer->nlags,local_80->n_cands);
          pFVar5 = local_80;
          pfVar14 = buffer->headF;
          pfVar14->next = pFVar10;
          pFVar10->prev = pfVar14;
          if (1 < buffer->size_cir_buffer) {
            iVar25 = 1;
            pFVar17 = pFVar10;
            do {
              pFVar10 = alloc_frame(buffer->nlags,pFVar5->n_cands);
              pFVar17->next = pFVar10;
              pFVar10->prev = pFVar17;
              iVar25 = iVar25 + 1;
              pFVar17 = pFVar10;
            } while (iVar25 < buffer->size_cir_buffer);
          }
          pfVar14 = buffer->tailF;
          pFVar10->next = pfVar14;
          pfVar14->prev = pFVar10;
          buffer->cir_buff_growth_count = buffer->cir_buff_growth_count + 1;
        }
        else {
          fprintf(_stderr,
                  "too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n"
                  ,(ulong)uVar6);
        }
        if (5 < (int)uVar6) {
          return 1;
        }
      }
      pFVar10 = buffer->headF;
      pFVar10->rms = local_f8->rms[uVar7];
      get_fast_cands(fdata,(float *)local_58,(int)uVar7,buffer->step,buffer->size,local_70,
                     buffer->start,buffer->nlags,&engref,&maxloc,&maxval,pFVar10->cp,buffer->peaks,
                     buffer->locs,&ncand,local_80,&buffer->dbsize,&buffer->dbdata);
      pFVar10 = buffer->headF;
      piVar2 = buffer->locs;
      pDVar3 = pFVar10->dp;
      psVar20 = pDVar3->locs;
      pfVar19 = pDVar3->pvals;
      pfVar4 = buffer->peaks;
      if (ncand != 0) {
        lVar21 = 0;
        lVar12 = 0;
        lVar22 = 0;
        do {
          pfVar19[lVar22] = pfVar4[lVar22];
          psVar20[lVar22] = (short)piVar2[lVar22];
          lVar22 = lVar22 + 1;
          lVar12 = lVar12 + -2;
          lVar21 = lVar21 + -4;
        } while (ncand != (int)lVar22);
        psVar20 = (short *)((long)psVar20 - lVar12);
        pfVar19 = (float *)((long)pfVar19 - lVar21);
      }
      *psVar20 = -1;
      *pfVar19 = maxval;
      pfVar19 = pDVar3->mpvals;
      pfVar19[ncand] = buffer->vbias + maxval;
      if (0 < ncand) {
        lVar21 = 0;
        do {
          pfVar19[lVar21] = 1.0 - (1.0 - (float)piVar2[lVar21] * buffer->lagwt) * pfVar4[lVar21];
          lVar21 = lVar21 + 1;
        } while (ncand != lVar21);
      }
      iVar25 = ncand + 1;
      pDVar3->ncands = (short)iVar25;
      if (-1 < ncand) {
        uVar6 = (uint)pFVar10->prev->dp->ncands;
        local_78 = (ulong)(ncand + 1);
        local_90 = (float *)CONCAT44(local_90._4_4_,uVar6);
        uVar13 = 0;
        ncand = iVar25;
        do {
          sVar24 = buffer->headF->dp->locs[uVar13];
          if (sVar24 < 1) {
            if ((short)local_90 < 1) goto LAB_001193e6;
            pDVar3 = buffer->headF->prev->dp;
            uVar23 = 0;
            uVar18 = 0;
            fVar29 = 3.4028235e+38;
            do {
              if (pDVar3->locs[uVar23] < 1) {
                fVar30 = 0.0;
              }
              else {
                fVar30 = buffer->tfact_a * (float)local_c8[uVar7] +
                         buffer->tfact_s * (float)local_c0[uVar7] + buffer->tcost;
              }
              fVar30 = fVar30 + pDVar3->dpvals[uVar23];
              if (fVar30 < fVar29) {
                uVar18 = uVar23 & 0xffffffff;
                fVar29 = fVar30;
              }
              sVar24 = (short)uVar18;
              uVar23 = uVar23 + 1;
            } while (uVar6 != uVar23);
          }
          else if ((short)local_90 < 1) {
LAB_001193e6:
            sVar24 = 0;
            fVar29 = 3.4028235e+38;
          }
          else {
            local_b8 = (float *)(double)(int)sVar24;
            uVar23 = 0;
            uVar18 = 0;
            fVar29 = 3.4028235e+38;
            do {
              uVar1 = buffer->headF->prev->dp->locs[uVar23];
              if ((short)uVar1 < 1) {
                fVar30 = buffer->tfact_a / (float)local_c8[uVar7] +
                         buffer->tfact_s * (float)local_c0[uVar7] + buffer->tcost;
              }
              else {
                dVar32 = log((double)local_b8 / (double)uVar1);
                fVar30 = (float)dVar32;
                fVar33 = ABS(buffer->ln2 + fVar30) + buffer->fdouble;
                if (ABS(fVar30) <= fVar33) {
                  fVar33 = ABS(fVar30);
                }
                fVar30 = ABS(fVar30 - buffer->ln2) + buffer->fdouble;
                if (fVar33 <= fVar30) {
                  fVar30 = fVar33;
                }
                fVar30 = fVar30 * buffer->freqwt;
              }
              fVar30 = fVar30 + buffer->headF->prev->dp->dpvals[uVar23];
              if (fVar30 < fVar29) {
                uVar18 = uVar23 & 0xffffffff;
                fVar29 = fVar30;
              }
              sVar24 = (short)uVar18;
              uVar23 = uVar23 + 1;
            } while (uVar6 != uVar23);
          }
          pDVar3 = buffer->headF->dp;
          if ((uVar7 == 0) && (buffer->first_time != 0)) {
            pDVar3->dpvals[uVar13] = pDVar3->mpvals[uVar13];
            sVar24 = 0;
          }
          else {
            pDVar3->dpvals[uVar13] = fVar29 + pDVar3->mpvals[uVar13];
          }
          pDVar3->prept[uVar13] = sVar24;
          uVar13 = uVar13 + 1;
          iVar25 = ncand;
        } while (uVar13 != local_78);
      }
      ncand = iVar25;
      if ((long)uVar7 < (long)(iVar11 + -1)) {
        buffer->headF = buffer->headF->next;
      }
      if (1 < debug_level) {
        fprintf(_stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",(double)engref,(double)maxval,
                uVar7 & 0xffffffff,(ulong)(uint)maxloc);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_88);
  }
  *vecsize = 0;
  iVar11 = iVar11 + buffer->num_active_frames;
  buffer->num_active_frames = iVar11;
  if ((last_time == 0) && (iVar11 < buffer->size_frame_hist)) goto LAB_00119880;
  if (debug_level != 0) {
    fprintf(_stderr,"available frames for backtracking: %d\n");
  }
  pFVar10 = buffer->headF;
  pDVar3 = pFVar10->dp;
  sVar24 = pDVar3->ncands;
  uVar6 = (uint)sVar24;
  if ((int)uVar6 < 1) {
    uVar7 = 0;
  }
  else {
    psVar20 = pDVar3->prept;
    pfVar19 = pDVar3->dpvals;
    piVar2 = buffer->pcands;
    uVar13 = 0;
    fVar29 = 3.4028235e+38;
    uVar7 = 0;
    do {
      if (pfVar19[uVar13] < fVar29) {
        uVar7 = uVar13 & 0xffffffff;
        fVar29 = pfVar19[uVar13];
      }
      piVar2[uVar13] = (int)psVar20[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  if (last_time == 0) {
    uVar13 = 0;
    pfVar14 = pFVar10;
    do {
      uVar13 = (ulong)((int)uVar13 + 1);
      pfVar14 = pfVar14->prev;
      if (sVar24 < 2) {
LAB_0011960c:
        buffer->cmpthF = pfVar14;
        uVar7 = (ulong)(uint)*buffer->pcands;
        bVar28 = true;
        if (debug_level != 0) {
          fprintf(_stderr,"paths went back %d frames before converging\n",uVar13);
        }
        goto LAB_00119626;
      }
      bVar28 = true;
      uVar18 = 1;
      do {
        if (*buffer->pcands != buffer->pcands[uVar18]) {
          bVar28 = false;
        }
        uVar18 = uVar18 + 1;
      } while (uVar6 != uVar18);
      if (bVar28) goto LAB_0011960c;
      if (0 < sVar24) {
        psVar20 = pfVar14->dp->prept;
        piVar2 = buffer->pcands;
        uVar18 = 0;
        do {
          piVar2[uVar18] = (int)psVar20[piVar2[uVar18]];
          uVar18 = uVar18 + 1;
        } while (uVar6 != uVar18);
      }
    } while (pfVar14 != buffer->tailF);
    if (buffer->size_frame_out <= buffer->num_active_frames) goto LAB_00119579;
    buffer->cmpthF = (Frame *)0x0;
    bVar28 = false;
  }
  else {
LAB_00119579:
    buffer->cmpthF = pFVar10;
    bVar28 = true;
  }
LAB_00119626:
  uVar13 = 0;
  if ((bVar28) && (pfVar14 = buffer->cmpthF, pfVar14 != buffer->tailF->prev)) {
    uVar13 = 0;
    do {
      if (uVar13 == (uint)buffer->output_buf_size) {
        buffer->output_buf_size = buffer->output_buf_size * 2;
        if (debug_level != 0) {
          fprintf(_stderr,"reallocating space for output frames: %d\n");
        }
        pfVar19 = (float *)ckrealloc(buffer->rms_speech,(long)buffer->output_buf_size << 2);
        buffer->rms_speech = pfVar19;
        pfVar19 = (float *)ckrealloc(buffer->f0p,(long)buffer->output_buf_size << 2);
        buffer->f0p = pfVar19;
        pfVar19 = (float *)ckrealloc(buffer->vuvp,(long)buffer->output_buf_size << 2);
        buffer->vuvp = pfVar19;
        pfVar19 = (float *)ckrealloc(buffer->acpkp,(long)buffer->output_buf_size << 2);
        buffer->acpkp = pfVar19;
      }
      buffer->rms_speech[uVar13] = pfVar14->rms;
      pDVar3 = pfVar14->dp;
      iVar25 = (int)uVar7;
      buffer->acpkp[uVar13] = pDVar3->pvals[iVar25];
      sVar24 = pDVar3->locs[iVar25];
      iVar11 = (int)sVar24;
      pfVar19 = buffer->vuvp;
      pfVar19[uVar13] = 1.0;
      uVar7 = (ulong)(uint)(int)pDVar3->prept[iVar25];
      if (sVar24 < 1) {
        buffer->f0p[uVar13] = 0.0;
        pfVar19[uVar13] = 0.0;
      }
      else {
        fVar29 = (float)iVar11;
        iVar25 = iVar11 - buffer->start;
        if ((iVar25 != 0 && buffer->start <= iVar11) && (iVar11 < buffer->stop)) {
          pfVar19 = pfVar14->cp->correl;
          fVar30 = pfVar19[iVar25];
          fVar33 = (pfVar19[(long)iVar25 + 1] + pfVar19[(long)iVar25 + -1]) - (fVar30 + fVar30);
          fVar33 = fVar33 + fVar33;
          if (1e-06 < ABS(fVar33)) {
            fVar29 = fVar29 + (2.0 - (fVar30 * -8.0 +
                                     pfVar19[(long)iVar25 + 1] * 5.0 +
                                     pfVar19[(long)iVar25 + -1] * 3.0) / fVar33);
          }
        }
        buffer->f0p[uVar13] = (float)(local_98 / (double)fVar29);
      }
      pfVar14 = pfVar14->prev;
      if (1 < debug_level) {
        dp_f0();
      }
      uVar13 = uVar13 + 1;
    } while ((bool)(bVar28 & pfVar14 != buffer->tailF->prev));
  }
  if (bVar28) {
    *vecsize = (int)uVar13;
    buffer->tailF = buffer->cmpthF->next;
    buffer->num_active_frames = buffer->num_active_frames - (int)uVar13;
  }
LAB_00119880:
  if (debug_level != 0) {
    dp_f0((snack *)vecsize);
  }
  *local_40 = buffer->f0p;
  *local_38 = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  if (buffer->first_time != 0) {
    buffer->first_time = 0;
  }
  return 0;
}

Assistant:

dp_f0(float *fdata, int buff_size, int sdstep, double freq, F0_params *par,
      float **f0p_pt, float **vuvp_pt, float **rms_speech_pt, float **acpkp_pt,
      int *vecsize, int last_time, Buffer *buffer)
{
  float  maxval, engref, *sta, *rms_ratio, *dsdata;
  float  *downsample(float *input, int samsin, int state_idx, double freq,
                     int *samsout, int decimate, int first_time, int last_time,
                     int *ncoeff, int *ncoefft, float *b, float **foutput,
                     float **co, float **mem, float *state, int *fsize);
  register float ttemp, ftemp, ft1, ferr, err, errmin;
  register int  i, j, k, loc1, loc2;
  int   nframes, maxloc, ncand, ncandp, minloc,
        decimate, samsds;

  Stat *stat = NULL;

  nframes = get_Nframes((long) buff_size, buffer->pad, buffer->step); /* # of whole frames */

  if(debug_level)
    Fprintf(stderr,
	    "******* Computing %d dp frames ******** from %d points\n", nframes, buff_size);

  /* Now downsample the signal for coarse peak estimates. */

  decimate = (int)(freq/2000.0);    /* downsample to about 2kHz */
  if (decimate <= 1)
    dsdata = fdata;
  else {
    samsds = ((nframes-1) * buffer->step + buffer->ncomp) / decimate;
    if (samsds < 1)
      return 1;                     /* skip final frame if it is too small */
    dsdata = downsample(fdata, buff_size, sdstep, freq, &samsds, decimate, 
			buffer->first_time, last_time, &buffer->ncoeff,
                        &buffer->ncoefft, buffer->b, &buffer->foutput,
                        &buffer->co, &buffer->mem, buffer->state, &buffer->fsize);
    if (!dsdata) {
      Fprintf(stderr, "can't get downsampled data.\n");
      return 1;
    }
  }

  /* Get a function of the "stationarity" of the speech signal. */

  stat = get_stationarity(fdata, freq, buff_size, nframes, buffer->step, buffer->first_time,
                          buffer);
  if (!stat) { 
    Fprintf(stderr, "can't get stationarity\n");
    return(1);
  }
  sta = stat->stat;
  rms_ratio = stat->rms_ratio;

  /***********************************************************************/
  /* MAIN FUNDAMENTAL FREQUENCY ESTIMATION LOOP */
  /***********************************************************************/
  if(!buffer->first_time && nframes > 0) buffer->headF = buffer->headF->next;

  for(i = 0; i < nframes; i++) {
 
    /* NOTE: This buffer growth provision is probably not necessary.
       It was put in (with errors) by Derek Lin and apparently never
       tested.  My tests and analysis suggest it is completely
       superfluous. DT 9/5/96 */
    /* Dynamically allocating more space for the circular buffer */
    if(buffer->headF == buffer->tailF->prev){
      Frame *frm;

      if(buffer->cir_buff_growth_count > 5){
	Fprintf(stderr,
		"too many requests (%d) for dynamically allocating space.\n   There may be a problem in finding converged path.\n",buffer->cir_buff_growth_count);
	return(1);
      }
      if(debug_level) 
	Fprintf(stderr, "allocating %d more frames for DP circ. buffer.\n", buffer->size_cir_buffer);
      frm = alloc_frame(buffer->nlags, par->n_cands);
      buffer->headF->next = frm;
      frm->prev = buffer->headF;
      for(k=1; k<buffer->size_cir_buffer; k++){
	frm->next = alloc_frame(buffer->nlags, par->n_cands);
	frm->next->prev = frm;
	frm = frm->next;
      }
      frm->next = buffer->tailF;
      buffer->tailF->prev = frm;
      buffer->cir_buff_growth_count++;
    }

    buffer->headF->rms = stat->rms[i];
    get_fast_cands(fdata, dsdata, i, buffer->step, buffer->size, decimate, buffer->start,
		   buffer->nlags, &engref, &maxloc,
		   &maxval, buffer->headF->cp, buffer->peaks, buffer->locs, &ncand, par,
		   &buffer->dbsize, &buffer->dbdata);
    
    /*    Move the peak value and location arrays into the dp structure */
    {
      register float *ftp1, *ftp2;
      register short *sp1;
      register int *sp2;
      
      for(ftp1 = buffer->headF->dp->pvals, ftp2 = buffer->peaks,
	  sp1 = buffer->headF->dp->locs, sp2 = buffer->locs, j=ncand; j--; ) {
	*ftp1++ = *ftp2++;
	*sp1++ = *sp2++;
      }
      *sp1 = -1;		/* distinguish the UNVOICED candidate */
      *ftp1 = maxval;
      buffer->headF->dp->mpvals[ncand] = buffer->vbias+maxval; /* (high cost if cor. is high)*/
    }

    /* Apply a lag-dependent weight to the peaks to encourage the selection
       of the first major peak.  Translate the modified peak values into
       costs (high peak ==> low cost). */
    for(j=0; j < ncand; j++){
      ftemp = 1.0f - ((float)buffer->locs[j] * buffer->lagwt);
      buffer->headF->dp->mpvals[j] = 1.0f - (buffer->peaks[j] * ftemp);
    }
    ncand++;			/* include the unvoiced candidate */
    buffer->headF->dp->ncands = ncand;

    /*********************************************************************/
    /*    COMPUTE THE DISTANCE MEASURES AND ACCUMULATE THE COSTS.       */
    /*********************************************************************/

    ncandp = buffer->headF->prev->dp->ncands;
    for(k=0; k<ncand; k++){	/* for each of the current candidates... */
      minloc = 0;
      errmin = FLT_MAX;
      if((loc2 = buffer->headF->dp->locs[k]) > 0) { /* current cand. is voiced */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  /*    Get cost due to inter-frame period change. */
	  loc1 = buffer->headF->prev->dp->locs[j];
	  if (loc1 > 0) { /* prev. was voiced */
	    ftemp = (float) log(((double) loc2) / loc1);
	    ttemp = (float) fabs(ftemp);
	    ft1 = (float) (buffer->fdouble + fabs(ftemp + buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ft1 = (float) (buffer->fdouble + fabs(ftemp - buffer->ln2));
	    if (ttemp > ft1)
	      ttemp = ft1;
	    ferr = ttemp * buffer->freqwt;
	  } else {		/* prev. was unvoiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a / rms_ratio[i]);
	  }
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      } else {			/* this is the unvoiced candidate */
	for(j=0; j<ncandp; j++){ /* for each PREVIOUS candidate... */
	  
	  /*    Get voicing transition cost. */
	  if (buffer->headF->prev->dp->locs[j] > 0) { /* previous was voiced */
	    ferr = buffer->tcost + (buffer->tfact_s * sta[i]) + (buffer->tfact_a * rms_ratio[i]);
	  }
	  else
	    ferr = 0.0;
	  /*    Add in cumulative cost associated with previous peak. */
	  err = ferr + buffer->headF->prev->dp->dpvals[j];
	  if(err < errmin){	/* find min. cost */
	    errmin = err;
	    minloc = j;
	  }
	}
      }
      /* Now have found the best path from this cand. to prev. frame */
      if (buffer->first_time && i==0) {		/* this is the first frame */
	buffer->headF->dp->dpvals[k] = buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = 0;
      } else {
	buffer->headF->dp->dpvals[k] = errmin + buffer->headF->dp->mpvals[k];
	buffer->headF->dp->prept[k] = minloc;
      }
    } /*    END OF THIS DP FRAME */

    if (i < nframes - 1)
      buffer->headF = buffer->headF->next;
    
    if (debug_level >= 2) {
      Fprintf(stderr,"%d engref:%10.0f max:%7.5f loc:%4d\n",
	      i,engref,maxval,maxloc);
    }
    
  } /* end for (i ...) */

  /***************************************************************/
  /* DONE WITH FILLING DP STRUCTURES FOR THE SET OF SAMPLED DATA */
  /*    NOW FIND A CONVERGED DP PATH                             */
  /***************************************************************/

  *vecsize = 0;			/* # of output frames returned */

  buffer->num_active_frames += nframes;

  if( buffer->num_active_frames >= buffer->size_frame_hist  || last_time ){
    Frame *frm;
    int  num_paths, best_cand, frmcnt, checkpath_done = 1;
    float patherrmin;
      
    if(debug_level)
      Fprintf(stderr, "available frames for backtracking: %d\n",
buffer->num_active_frames);
      
    patherrmin = FLT_MAX;
    best_cand = 0;
    num_paths = buffer->headF->dp->ncands;

    /* Get the best candidate for the final frame and initialize the
       paths' backpointers. */
    frm = buffer->headF;
    for(k=0; k < num_paths; k++) {
      if (patherrmin > buffer->headF->dp->dpvals[k]){
	patherrmin = buffer->headF->dp->dpvals[k];
	best_cand = k;	/* index indicating the best candidate at a path */
      }
      buffer->pcands[k] = frm->dp->prept[k];
    }

    if(last_time){     /* Input data was exhausted. force final outputs. */
      buffer->cmpthF = buffer->headF;		/* Use the current frame as starting point. */
    } else {
      /* Starting from the most recent frame, trace back each candidate's
	 best path until reaching a common candidate at some past frame. */
      frmcnt = 0;
      while (1) {
	frm = frm->prev;
	frmcnt++;
	checkpath_done = 1;
	for(k=1; k < num_paths; k++){ /* Check for convergence. */
	  if(buffer->pcands[0] != buffer->pcands[k])
	    checkpath_done = 0;
	}
	if( ! checkpath_done) { /* Prepare for checking at prev. frame. */
	  for(k=0; k < num_paths; k++){
	    buffer->pcands[k] = frm->dp->prept[buffer->pcands[k]];
	  }
	} else {	/* All paths have converged. */
	  buffer->cmpthF = frm;
	  best_cand = buffer->pcands[0];
	  if(debug_level)
	    Fprintf(stderr,
		    "paths went back %d frames before converging\n",frmcnt);
	  break;
	}
	if(frm == buffer->tailF){	/* Used all available data? */
	  if( buffer->num_active_frames < buffer->size_frame_out) { /* Delay some more? */
	    checkpath_done = 0; /* Yes, don't backtrack at this time. */
	    buffer->cmpthF = NULL;
	  } else {		/* No more delay! Force best-guess output. */
	    checkpath_done = 1;
	    buffer->cmpthF = buffer->headF;
	    /*	    Fprintf(stderr,
		    "WARNING: no converging path found after going back %d frames, will use the lowest cost path\n",num_active_frames);*/
	  }
	  break;
	} /* end if (frm ...) */
      }	/* end while (1) */
    } /* end if (last_time) ... else */

    /*************************************************************/
    /* BACKTRACKING FROM cmpthF (best_cand) ALL THE WAY TO tailF    */
    /*************************************************************/
    i = 0;
    frm = buffer->cmpthF;	/* Start where convergence was found (or faked). */
    while( frm != buffer->tailF->prev && checkpath_done){
      if( i == buffer->output_buf_size ){ /* Need more room for outputs? */
	buffer->output_buf_size *= 2;
	if(debug_level)
	  Fprintf(stderr,
		  "reallocating space for output frames: %d\n",
		  buffer->output_buf_size);
	buffer->rms_speech = (float *) ckrealloc((void *) buffer->rms_speech,
				       sizeof(float) * buffer->output_buf_size);
	/*	spsassert(rms_speech, "rms_speech realloc failed in dp_f0()");*/
	buffer->f0p = (float *) ckrealloc((void *) buffer->f0p,
				sizeof(float) * buffer->output_buf_size);
	/*	spsassert(f0p, "f0p realloc failed in dp_f0()");*/
	buffer->vuvp = (float *) ckrealloc((void *) buffer->vuvp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(vuvp, "vuvp realloc failed in dp_f0()");*/
	buffer->acpkp = (float *) ckrealloc((void *) buffer->acpkp, sizeof(float) * buffer->output_buf_size);
	/*	spsassert(acpkp, "acpkp realloc failed in dp_f0()");*/
      }
      buffer->rms_speech[i] = frm->rms;
      buffer->acpkp[i] =  frm->dp->pvals[best_cand];
      loc1 = frm->dp->locs[best_cand];
      buffer->vuvp[i] = 1.0;
      best_cand = frm->dp->prept[best_cand];
      ftemp = (float) loc1;
      if(loc1 > 0) {		/* Was f0 actually estimated for this frame? */
	if (loc1 > buffer->start && loc1 < buffer->stop) { /* loc1 must be a local maximum. */
	  float cormax, cprev, cnext, den;
		  
	  j = loc1 - buffer->start;
	  cormax = frm->cp->correl[j];
	  cprev = frm->cp->correl[j+1];
	  cnext = frm->cp->correl[j-1];
	  den = (float) (2.0 * ( cprev + cnext - (2.0 * cormax) ));
	  /*
	   * Only parabolic interpolate if cormax is indeed a local 
	   * turning point. Find peak of curve that goes though the 3 points
	   */
		  
	  if (fabs(den) > 0.000001)
	    ftemp += 2.0f - ((((5.0f*cprev)+(3.0f*cnext)-(8.0f*cormax))/den));
	}
	buffer->f0p[i] = (float) (freq/ftemp);
      } else {		/* No valid estimate; just fake some arbitrary F0. */
	buffer->f0p[i] = 0;
	buffer->vuvp[i] = 0.0;
      }
      frm = frm->prev;
	  
      if (debug_level >= 2)
	Fprintf(stderr," i:%4d%8.1f%8.1f\n",i,buffer->f0p[i],buffer->vuvp[i]);
      /* f0p[i] starts from the most recent one */ 
      /* Need to reverse the order in the calling function */
      i++;
    } /* end while() */
    if (checkpath_done){
      *vecsize = i;
      buffer->tailF = buffer->cmpthF->next;
      buffer->num_active_frames -= *vecsize;
    }
  } /* end if() */

  if (debug_level)
    Fprintf(stderr, "writing out %d frames.\n", *vecsize);
  
  *f0p_pt = buffer->f0p;
  *vuvp_pt = buffer->vuvp;
  *acpkp_pt = buffer->acpkp;
  *rms_speech_pt = buffer->rms_speech;
  /*  *acpkp_pt = acpkp;*/
  
  if(buffer->first_time) buffer->first_time = 0;
  return(0);
}